

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Precompute.cpp
# Opt level: O2

bool __thiscall wasm::Precompute::canEmitConstantFor(Precompute *this,Type type)

{
  bool bVar1;
  bool bVar2;
  Type local_18;
  Type type_local;
  
  local_18.id = type.id;
  bVar1 = wasm::Type::isFunction(&local_18);
  bVar2 = true;
  if (!bVar1) {
    bVar1 = wasm::Type::isString(&local_18);
    if (!bVar1) {
      bVar2 = wasm::Type::isRef(&local_18);
      bVar2 = !bVar2;
    }
  }
  return bVar2;
}

Assistant:

bool canEmitConstantFor(Type type) {
    // A function is fine to emit a constant for - we'll emit a RefFunc, which
    // is compact and immutable, so there can't be a problem.
    if (type.isFunction()) {
      return true;
    }
    // We can emit a StringConst for a string constant.
    if (type.isString()) {
      return true;
    }
    // All other reference types cannot be precomputed. Even an immutable GC
    // reference is not currently something this pass can handle, as it will
    // evaluate and reevaluate code multiple times in e.g. propagateLocals, see
    // the comment above.
    if (type.isRef()) {
      return false;
    }

    return true;
  }